

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

gc_heap_ptr<mjs::gc_string> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::gc_string,std::basic_string_view<char,std::char_traits<char>>const&>
          (gc_heap *this,size_t num_bytes,basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong *in_RCX;
  slot *psVar4;
  undefined8 extraout_RDX;
  ulong uVar5;
  allocation_result aVar6;
  gc_heap_ptr<mjs::gc_string> gVar7;
  
  aVar6 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  psVar4 = aVar6.obj;
  if (*(int *)((long)psVar4 + -4) == -1) {
    uVar1 = *in_RCX;
    uVar3 = (uint32_t)uVar1;
    psVar4->new_position = uVar3;
    if (uVar3 != 0) {
      uVar2 = in_RCX[1];
      uVar5 = 0;
      do {
        *(int *)((long)psVar4 + uVar5 * 4 + 4) = (int)*(char *)(uVar2 + uVar5);
        uVar5 = uVar5 + 1;
      } while ((uVar1 & 0xffffffff) != uVar5);
    }
    *(undefined4 *)((long)psVar4 + -4) = gc_type_info_registration<mjs::gc_string>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar6.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar7.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar7.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_string>)gVar7.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_string, Args = <const std::basic_string_view<char> &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}